

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::Print(XMLPrinter *this,char *format,...)

{
  int iVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  char *p;
  int len;
  va_list va;
  __va_list_tag *in_stack_ffffffffffffff08;
  undefined1 local_e8 [4];
  int in_stack_ffffffffffffff1c;
  DynArray<char,_20> *in_stack_ffffffffffffff20;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = local_e8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x78) == 0) {
    iVar1 = TIXML_VSCPRINTF(in_RDI,in_stack_ffffffffffffff08);
    local_18 = local_e8;
    local_20 = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 0x10;
    pcVar2 = DynArray<char,_20>::PushArr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    vsnprintf(pcVar2 + -1,(long)(iVar1 + 1),local_10,&local_28);
  }
  else {
    vfprintf(*(FILE **)(in_RDI + 0x78),in_RSI,&local_28);
  }
  return;
}

Assistant:

void XMLPrinter::Print( const char* format, ... )
{
    va_list     va;
    va_start( va, format );

    if ( _fp ) {
        vfprintf( _fp, format, va );
    }
    else {
        int len = TIXML_VSCPRINTF( format, va );
        // Close out and re-start the va-args
        va_end( va );
        va_start( va, format );
        TIXMLASSERT( _buffer.Size() > 0 && _buffer[_buffer.Size() - 1] == 0 );
        char* p = _buffer.PushArr( len ) - 1;	// back up over the null terminator.
		TIXML_VSNPRINTF( p, len+1, format, va );
    }
    va_end( va );
}